

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

curl_socket_t Curl_conn_get_socket(Curl_easy *data,int sockindex)

{
  curl_socket_t local_34;
  Curl_cfilter *local_30;
  Curl_cfilter *cf;
  int sockindex_local;
  Curl_easy *data_local;
  
  if (data->conn == (connectdata *)0x0) {
    local_30 = (Curl_cfilter *)0x0;
  }
  else {
    local_30 = data->conn->cfilter[sockindex];
  }
  if ((local_30 == (Curl_cfilter *)0x0) || ((local_30->field_0x24 & 1) != 0)) {
    if (data->conn == (connectdata *)0x0) {
      local_34 = -1;
    }
    else {
      local_34 = data->conn->sock[sockindex];
    }
    data_local._4_4_ = local_34;
  }
  else {
    data_local._4_4_ = Curl_conn_cf_get_socket(local_30,data);
  }
  return data_local._4_4_;
}

Assistant:

curl_socket_t Curl_conn_get_socket(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn ? data->conn->cfilter[sockindex] : NULL;
  /* if the top filter has not connected, ask it (and its sub-filters)
   * for the socket. Otherwise conn->sock[sockindex] should have it.
   */
  if(cf && !cf->connected)
    return Curl_conn_cf_get_socket(cf, data);
  return data->conn ? data->conn->sock[sockindex] : CURL_SOCKET_BAD;
}